

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_device.c
# Opt level: O0

void gena_process_subscription_request(SOCKINFO *info,http_message_t *request)

{
  code *pcVar1;
  undefined8 uVar2;
  int iVar3;
  Upnp_Handle_Type UVar4;
  parse_status_t pVar5;
  uint uVar6;
  UpnpSubscriptionRequest *p;
  http_header_t *phVar7;
  char *path;
  time_t tVar8;
  undefined1 auStack_d8 [4];
  int rc;
  memptr timeout_hdr;
  memptr callback_hdr;
  char *event_url_path;
  memptr nt_hdr;
  UpnpDevice_Handle device_handle;
  Upnp_FunPtr callback_fun;
  void *cookie;
  Handle_Info *handle_info;
  uuid_upnp uid;
  subscription *sub;
  service_info *service;
  int time_out;
  int return_code;
  Upnp_SID temp_sid;
  UpnpSubscriptionRequest *request_struct;
  http_message_t *request_local;
  SOCKINFO *info_local;
  
  p = UpnpSubscriptionRequest_new();
  service._4_4_ = 1;
  service._0_4_ = 0x709;
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x548,"Subscription Request Received:\n")
  ;
  phVar7 = httpmsg_find_hdr(request,0xe,(memptr *)&event_url_path);
  if (phVar7 == (http_header_t *)0x0) {
    error_respond(info,400,request);
  }
  else {
    iVar3 = memptr_cmp_nocase((memptr *)&event_url_path,"upnp:event");
    if (iVar3 == 0) {
      phVar7 = httpmsg_find_hdr(request,0x12,(memptr *)0x0);
      if (phVar7 == (http_header_t *)0x0) {
        path = str_alloc((request->uri).pathquery.buff,(request->uri).pathquery.size);
        if (path == (char *)0x0) {
          error_respond(info,500,request);
        }
        else {
          UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x569,
                     "SubscriptionRequest for event URL path: %s\n",path);
          HandleLock(".upnp/src/gena/gena_device.c",0x56d);
          UVar4 = GetDeviceHandleInfoForPath
                            (path,(uint)(info->foreign_sockaddr).ss_family,
                             (UpnpDevice_Handle *)((long)&nt_hdr.length + 4),(Handle_Info **)&cookie
                             ,(service_info **)&sub);
          if (UVar4 == HND_DEVICE) {
            free(path);
            if ((sub == (subscription *)0x0) || ((int)sub->expireTime == 0)) {
              error_respond(info,0x194,request);
              HandleUnlock(".upnp/src/gena/gena_device.c",0x57d);
            }
            else {
              UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x584,
                         "Subscription Request: Number of Subscriptions already %d\n Max Subscriptions allowed: %d\n"
                         ,(ulong)*(uint *)((long)&sub->expireTime + 4),
                         *(undefined4 *)((long)cookie + 0x278));
              if ((*(int *)((long)cookie + 0x278) == -1) ||
                 (*(int *)((long)&sub->expireTime + 4) < *(int *)((long)cookie + 0x278))) {
                uid._8_8_ = malloc(0xc0);
                if ((void *)uid._8_8_ == (void *)0x0) {
                  error_respond(info,500,request);
                  HandleUnlock(".upnp/src/gena/gena_device.c",0x595);
                }
                else {
                  *(undefined4 *)(uid._8_8_ + 0x2c) = 0;
                  *(undefined4 *)(uid._8_8_ + 0x38) = 0;
                  *(undefined8 *)(uid._8_8_ + 0xb8) = 0;
                  *(undefined8 *)(uid._8_8_ + 0x40) = 0;
                  *(undefined8 *)(uid._8_8_ + 0x48) = 0;
                  *(undefined8 *)(uid._8_8_ + 0x50) = 0;
                  iVar3 = ListInit((LinkedList *)(uid._8_8_ + 0x58),(cmp_routine)0x0,free);
                  if (iVar3 == 0) {
                    phVar7 = httpmsg_find_hdr(request,2,(memptr *)&timeout_hdr.length);
                    if (phVar7 == (http_header_t *)0x0) {
                      error_respond(info,0x19c,request);
                      freeSubscriptionList((subscription *)uid._8_8_);
                      HandleUnlock(".upnp/src/gena/gena_device.c",0x5a8);
                    }
                    else {
                      service._4_4_ =
                           create_url_list((memptr *)&timeout_hdr.length,
                                           (URL_list *)(uid._8_8_ + 0x40));
                      if (service._4_4_ == 0) {
                        error_respond(info,0x19c,request);
                        freeSubscriptionList((subscription *)uid._8_8_);
                        HandleUnlock(".upnp/src/gena/gena_device.c",0x5af);
                      }
                      else if (service._4_4_ == -0x68) {
                        error_respond(info,500,request);
                        freeSubscriptionList((subscription *)uid._8_8_);
                        HandleUnlock(".upnp/src/gena/gena_device.c",0x5b5);
                      }
                      else {
                        service._4_4_ =
                             gena_validate_delivery_urls(info,(URL_list *)(uid._8_8_ + 0x40));
                        if (service._4_4_ == 0) {
                          phVar7 = httpmsg_find_hdr(request,0x15,(memptr *)auStack_d8);
                          if ((phVar7 != (http_header_t *)0x0) &&
                             (pVar5 = matchstr(_auStack_d8,(size_t)timeout_hdr.buf,"%iSecond-%d%0",
                                               &service), pVar5 != PARSE_OK)) {
                            iVar3 = memptr_cmp_nocase((memptr *)auStack_d8,"Second-infinite");
                            if (iVar3 == 0) {
                              service._0_4_ = -1;
                            }
                            else {
                              service._0_4_ = 0x709;
                            }
                          }
                          if ((*(int *)((long)cookie + 0x27c) != -1) &&
                             (((int)service == -1 || (*(int *)((long)cookie + 0x27c) < (int)service)
                              ))) {
                            service._0_4_ = *(int *)((long)cookie + 0x27c);
                          }
                          if ((int)service < 0) {
                            *(undefined8 *)(uid._8_8_ + 0x30) = 0;
                          }
                          else {
                            tVar8 = time((time_t *)0x0);
                            *(time_t *)(uid._8_8_ + 0x30) = tVar8 + (int)service;
                          }
                          uuid_create((uuid_upnp *)&handle_info);
                          upnp_uuid_unpack((uuid_upnp *)&handle_info,(char *)&time_out);
                          uVar6 = snprintf((char *)uid._8_8_,0x2c,"uuid:%s",&time_out);
                          if ((((int)uVar6 < 0) || (0x2b < uVar6)) ||
                             (iVar3 = respond_ok(info,(int)service,(subscription *)uid._8_8_,request
                                                ), iVar3 != 0)) {
                            freeSubscriptionList((subscription *)uid._8_8_);
                            HandleUnlock(".upnp/src/gena/gena_device.c",0x5e6);
                          }
                          else {
                            *(undefined8 *)(uid._8_8_ + 0xb8) = *(undefined8 *)&sub->active;
                            *(undefined8 *)&sub->active = uid._8_8_;
                            *(int *)((long)&sub->expireTime + 4) =
                                 *(int *)((long)&sub->expireTime + 4) + 1;
                            UpnpSubscriptionRequest_strcpy_ServiceId(p,*(char **)(sub->sid + 8));
                            UpnpSubscriptionRequest_strcpy_UDN(p,*(char **)(sub->sid + 0x28));
                            UpnpSubscriptionRequest_strcpy_SID(p,(char *)uid._8_8_);
                            pcVar1 = *(code **)((long)cookie + 8);
                            uVar2 = *(undefined8 *)((long)cookie + 0x10);
                            HandleUnlock(".upnp/src/gena/gena_device.c",0x5f8);
                            (*pcVar1)(8,p,uVar2);
                          }
                        }
                        else {
                          error_respond(info,0x19c,request);
                          freeSubscriptionList((subscription *)uid._8_8_);
                          HandleUnlock(".upnp/src/gena/gena_device.c",0x5bc);
                        }
                      }
                    }
                  }
                  else {
                    error_respond(info,500,request);
                    HandleUnlock(".upnp/src/gena/gena_device.c",0x5a0);
                  }
                }
              }
              else {
                error_respond(info,500,request);
                HandleUnlock(".upnp/src/gena/gena_device.c",0x58e);
              }
            }
          }
          else {
            free(path);
            error_respond(info,500,request);
            HandleUnlock(".upnp/src/gena/gena_device.c",0x576);
          }
        }
      }
      else {
        error_respond(info,400,request);
      }
    }
    else {
      error_respond(info,0x19c,request);
    }
  }
  UpnpSubscriptionRequest_delete(p);
  return;
}

Assistant:

void gena_process_subscription_request(SOCKINFO *info, http_message_t *request)
{
	UpnpSubscriptionRequest *request_struct = UpnpSubscriptionRequest_new();
	Upnp_SID temp_sid;
	int return_code = 1;
	int time_out = 1801;
	service_info *service;
	subscription *sub;
	uuid_upnp uid;
	struct Handle_Info *handle_info;
	void *cookie;
	Upnp_FunPtr callback_fun;
	UpnpDevice_Handle device_handle;
	memptr nt_hdr;
	char *event_url_path = NULL;
	memptr callback_hdr;
	memptr timeout_hdr;
	int rc = 0;

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"Subscription Request Received:\n");

	if (httpmsg_find_hdr(request, HDR_NT, &nt_hdr) == NULL) {
		error_respond(info, HTTP_BAD_REQUEST, request);
		goto exit_function;
	}

	/* check NT header */
	/* Windows Millenium Interoperability: */
	/* we accept either upnp:event, or upnp:propchange for the NT header */
	if (memptr_cmp_nocase(&nt_hdr, "upnp:event") != 0) {
		error_respond(info, HTTP_PRECONDITION_FAILED, request);
		goto exit_function;
	}

	/* if a SID is present then the we have a bad request "incompatible
	 * headers" */
	if (httpmsg_find_hdr(request, HDR_SID, NULL) != NULL) {
		error_respond(info, HTTP_BAD_REQUEST, request);
		goto exit_function;
	}
	/* look up service by eventURL */
	event_url_path = str_alloc(
		request->uri.pathquery.buff, request->uri.pathquery.size);
	if (event_url_path == NULL) {
		error_respond(info, HTTP_INTERNAL_SERVER_ERROR, request);
		goto exit_function;
	}

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"SubscriptionRequest for event URL path: %s\n",
		event_url_path);

	HandleLock(__FILE__, __LINE__);

	if (GetDeviceHandleInfoForPath(event_url_path,
		    info->foreign_sockaddr.ss_family,
		    &device_handle,
		    &handle_info,
		    &service) != HND_DEVICE) {
		free(event_url_path);
		error_respond(info, HTTP_INTERNAL_SERVER_ERROR, request);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	free(event_url_path);

	if (service == NULL || !service->active) {
		error_respond(info, HTTP_NOT_FOUND, request);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"Subscription Request: Number of Subscriptions already %d\n "
		"Max Subscriptions allowed: %d\n",
		service->TotalSubscriptions,
		handle_info->MaxSubscriptions);

	/* too many subscriptions */
	if (handle_info->MaxSubscriptions != -1 &&
		service->TotalSubscriptions >= handle_info->MaxSubscriptions) {
		error_respond(info, HTTP_INTERNAL_SERVER_ERROR, request);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	/* generate new subscription */
	sub = (subscription *)malloc(sizeof(subscription));
	if (sub == NULL) {
		error_respond(info, HTTP_INTERNAL_SERVER_ERROR, request);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	sub->ToSendEventKey = 0;
	sub->active = 0;
	sub->next = NULL;
	sub->DeliveryURLs.size = 0;
	sub->DeliveryURLs.URLs = NULL;
	sub->DeliveryURLs.parsedURLs = NULL;
	if (ListInit(&sub->outgoing, 0, free) != 0) {
		error_respond(info, HTTP_INTERNAL_SERVER_ERROR, request);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}

	/* check for valid callbacks */
	if (httpmsg_find_hdr(request, HDR_CALLBACK, &callback_hdr) == NULL) {
		error_respond(info, HTTP_PRECONDITION_FAILED, request);
		freeSubscriptionList(sub);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	return_code = create_url_list(&callback_hdr, &sub->DeliveryURLs);
	if (return_code == 0) {
		error_respond(info, HTTP_PRECONDITION_FAILED, request);
		freeSubscriptionList(sub);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	if (return_code == UPNP_E_OUTOF_MEMORY) {
		error_respond(info, HTTP_INTERNAL_SERVER_ERROR, request);
		freeSubscriptionList(sub);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	return_code = gena_validate_delivery_urls(info, &sub->DeliveryURLs);
	if (return_code != 0) {
		error_respond(info, HTTP_PRECONDITION_FAILED, request);
		freeSubscriptionList(sub);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	/* set the timeout */
	if (httpmsg_find_hdr(request, HDR_TIMEOUT, &timeout_hdr) != NULL) {
		if (matchstr(timeout_hdr.buf,
			    timeout_hdr.length,
			    "%iSecond-%d%0",
			    &time_out) == PARSE_OK) {
			/* nothing */
		} else if (memptr_cmp_nocase(&timeout_hdr, "Second-infinite") ==
			   0) {
			/* infinite timeout */
			time_out = -1;
		} else {
			/* default is > 1800 seconds */
			time_out = DEFAULT_TIMEOUT;
		}
	}
	/* replace infinite timeout with max timeout, if possible */
	if (handle_info->MaxSubscriptionTimeOut != -1) {
		if (time_out == -1 ||
			time_out > handle_info->MaxSubscriptionTimeOut) {
			time_out = handle_info->MaxSubscriptionTimeOut;
		}
	}
	if (time_out >= 0) {
		sub->expireTime = time(NULL) + time_out;
	} else {
		/* infinite time */
		sub->expireTime = 0;
	}

	/* generate SID */
	uuid_create(&uid);
	upnp_uuid_unpack(&uid, temp_sid);
	rc = snprintf(sub->sid, sizeof(sub->sid), "uuid:%s", temp_sid);

	/* respond OK */
	if (rc < 0 || (unsigned int)rc >= sizeof(sub->sid) ||
		(respond_ok(info, time_out, sub, request) != UPNP_E_SUCCESS)) {
		freeSubscriptionList(sub);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	/* add to subscription list */
	sub->next = service->subscriptionList;
	service->subscriptionList = sub;
	service->TotalSubscriptions++;

	/* finally generate callback for init table dump */
	UpnpSubscriptionRequest_strcpy_ServiceId(
		request_struct, service->serviceId);
	UpnpSubscriptionRequest_strcpy_UDN(request_struct, service->UDN);
	UpnpSubscriptionRequest_strcpy_SID(request_struct, sub->sid);

	/* copy callback */
	callback_fun = handle_info->Callback;
	cookie = handle_info->Cookie;

	HandleUnlock(__FILE__, __LINE__);

	/* make call back with request struct */
	/* in the future should find a way of mainting that the handle */
	/* is not unregistered in the middle of a callback */
	callback_fun(UPNP_EVENT_SUBSCRIPTION_REQUEST, request_struct, cookie);

exit_function:
	UpnpSubscriptionRequest_delete(request_struct);
}